

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

difference_type __thiscall
Json::ValueIteratorBase::computeDistance(ValueIteratorBase *this,SelfType *other)

{
  bool bVar1;
  _Self *in_RSI;
  _Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *in_RDI;
  iterator it;
  difference_type myDistance;
  _Self local_28;
  int local_1c;
  _Self *local_18;
  difference_type local_4;
  
  if ((((ulong)in_RDI[1]._M_node & 1) == 0) || (((ulong)in_RSI[1]._M_node & 1) == 0)) {
    local_1c = 0;
    local_28._M_node = in_RDI->_M_node;
    local_18 = in_RSI;
    while( true ) {
      bVar1 = std::operator!=(&local_28,local_18);
      if (!bVar1) break;
      local_1c = local_1c + 1;
      std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator++
                (in_RDI);
    }
    local_4 = local_1c;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ValueIteratorBase::difference_type
ValueIteratorBase::computeDistance(const SelfType& other) const {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
#ifdef JSON_USE_CPPTL_SMALLMAP
  return current_ - other.current_;
#else
  // Iterator for null value are initialized using the default
  // constructor, which initialize current_ to the default
  // std::map::iterator. As begin() and end() are two instance
  // of the default std::map::iterator, they can not be compared.
  // To allow this, we handle this comparison specifically.
  if (isNull_ && other.isNull_) {
    return 0;
  }

  // Usage of std::distance is not portable (does not compile with Sun Studio 12
  // RogueWave STL,
  // which is the one used by default).
  // Using a portable hand-made version for non random iterator instead:
  //   return difference_type( std::distance( current_, other.current_ ) );
  difference_type myDistance = 0;
  for (Value::ObjectValues::iterator it = current_; it != other.current_;
       ++it) {
    ++myDistance;
  }
  return myDistance;
#endif
#else
  if (isArray_)
    return ValueInternalArray::distance(iterator_.array_,
                                        other.iterator_.array_);
  return ValueInternalMap::distance(iterator_.map_, other.iterator_.map_);
#endif
}